

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O2

int StringToInt(tchar_t *In,int Hex)

{
  char *Mask;
  int v;
  int local_14;
  char *local_10;
  
  local_14 = 0;
  local_10 = In;
  if (Hex < 0) {
    ExprSkipSpace(&local_10);
    Mask = "%d";
    if ((*local_10 == '0') && (local_10[1] == 'x')) {
      local_10 = local_10 + 2;
      Mask = "%X";
    }
  }
  else {
    Mask = "%X";
    if (Hex == 0) {
      Mask = "%d";
    }
  }
  stscanf(local_10,Mask,&local_14);
  return local_14;
}

Assistant:

int StringToInt(const tchar_t* In, int Hex)
{
    int v=0;
    if (Hex<0)
    {
        ExprSkipSpace(&In);
        Hex = In[0]=='0' && In[1]=='x';
        if (Hex) In+=2;
    }
    stscanf(In,Hex ? T("%X"):T("%d"),&v);
    return v;
}